

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateMergeFromCodedStream
          (MessageGenerator *this,Printer *printer)

{
  string *value;
  int iVar1;
  bool bVar2;
  uint32 uVar3;
  Type TVar4;
  uint uVar5;
  Descriptor *pDVar6;
  FieldGenerator *pFVar7;
  Descriptor *pDVar8;
  uint uVar9;
  int i_00;
  uint i_01;
  uint i_02;
  uint i_03;
  uint extraout_EDX;
  uint i_04;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  Descriptor *extraout_RDX_01;
  Descriptor *extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar10;
  undefined8 extraout_RDX_04;
  long lVar11;
  protobuf *ppVar12;
  char *pcVar13;
  int i_3;
  long lVar14;
  int i;
  long lVar15;
  MessageGenerator *pMVar16;
  int i_2;
  FieldDescriptor *pFVar17;
  ulong uVar18;
  allocator<char> local_99;
  MessageGenerator *local_98;
  FieldGeneratorMap *local_90;
  string local_88;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ordered_fields;
  string local_50;
  
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x68) == '\x01') {
    io::Printer::Print(printer,
                       "bool $classname$::MergePartialFromCodedStream(\n    ::google::protobuf::io::CodedInputStream* input) {\n"
                       ,"classname",&this->classname_);
    io::Printer::Print(printer,
                       "  return _extensions_.ParseMessageSet(input, internal_default_instance(),\n                                      mutable_unknown_fields());\n"
                       ,"classname",&this->classname_);
    io::Printer::Print(printer,"}\n");
    return;
  }
  anon_unknown_0::SortFieldsByNumber(&ordered_fields,this->descriptor_);
  value = &this->classname_;
  io::Printer::Print(printer,
                     "bool $classname$::MergePartialFromCodedStream(\n    ::google::protobuf::io::CodedInputStream* input) {\n"
                     ,"classname",value);
  if (this->table_driven_ == true) {
    io::Printer::Indent(printer);
    FileLevelNamespace(&local_88,(string *)**(undefined8 **)(this->descriptor_ + 0x10));
    io::Printer::Print(printer,
                       "return ::google::protobuf::internal::MergePartialFromCodedStream(\n    this,\n    $file_namespace$::TableStruct::schema[\n      $classname$::kIndexInFileMessages],\n    input);\n"
                       ,"classname",value,"file_namespace",&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
  }
  else {
    io::Printer::Print(printer,
                       "#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure\n  ::google::protobuf::uint32 tag;\n"
                      );
    pDVar8 = this->descriptor_;
    if ((*(int *)(*(long *)(pDVar8 + 0x10) + 0x8c) != 3) &&
       (((this->options_).enforce_lite != false ||
        (*(int *)(*(long *)(*(long *)(pDVar8 + 0x10) + 0xa0) + 0xa8) == 3)))) {
      io::Printer::Print(printer,
                         "  ::google::protobuf::io::LazyStringOutputStream unknown_fields_string(\n      ::google::protobuf::NewPermanentCallback(&_internal_metadata_,\n          &::google::protobuf::internal::InternalMetadataWithArenaLite::\n              mutable_unknown_fields));\n  ::google::protobuf::io::CodedOutputStream unknown_fields_stream(\n      &unknown_fields_string, false);\n"
                         ,"classname",value);
      pDVar8 = this->descriptor_;
    }
    io::Printer::Print(printer,"  // @@protoc_insertion_point(parse_start:$full_name$)\n",
                       "full_name",*(string **)(pDVar8 + 8));
    io::Printer::Indent(printer);
    io::Printer::Print(printer,"for (;;) {\n");
    io::Printer::Indent(printer);
    pDVar8 = this->descriptor_;
    if ((long)*(int *)(pDVar8 + 0x2c) == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = internal::WireFormat::MakeTag
                        (ordered_fields.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_start
                         [(long)*(int *)(pDVar8 + 0x2c) + -1]);
      pDVar8 = this->descriptor_;
    }
    local_90 = (FieldGeneratorMap *)CONCAT44(local_90._4_4_,uVar3);
    lVar14 = *(long *)(pDVar8 + 0x18);
    local_98 = this;
    if (lVar14 == 0) {
      bVar2 = false;
    }
    else {
      lVar11 = 0;
      for (lVar15 = 0; bVar2 = lVar15 < *(int *)(lVar14 + 0x2c), lVar15 < *(int *)(lVar14 + 0x2c);
          lVar15 = lVar15 + 1) {
        pFVar17 = (FieldDescriptor *)(*(long *)(lVar14 + 0x30) + lVar11);
        TVar4 = FieldDescriptor::type(pFVar17);
        pDVar8 = extraout_RDX;
        if (TVar4 == TYPE_GROUP) {
          pDVar6 = FieldDescriptor::message_type(pFVar17);
          pDVar8 = extraout_RDX_00;
          if (pDVar6 == local_98->descriptor_) break;
        }
        lVar11 = lVar11 + 0xa8;
      }
    }
    lVar14 = 0;
    lVar11 = 0;
    while( true ) {
      uVar9 = (uint)pDVar8;
      if (*(int *)(*(long *)(local_98->descriptor_ + 0x10) + 0x88) <= lVar11) break;
      pFVar17 = (FieldDescriptor *)
                (*(long *)(*(long *)(local_98->descriptor_ + 0x10) + 0x98) + lVar14);
      TVar4 = FieldDescriptor::type(pFVar17);
      pDVar8 = extraout_RDX_01;
      if (TVar4 == TYPE_GROUP) {
        pDVar6 = FieldDescriptor::message_type(pFVar17);
        uVar9 = (uint)extraout_RDX_02;
        pDVar8 = extraout_RDX_02;
        if (pDVar6 == local_98->descriptor_) {
          bVar2 = true;
          break;
        }
      }
      lVar11 = lVar11 + 1;
      lVar14 = lVar14 + 0xa8;
    }
    uVar5 = 0x3fff;
    if (0x3fff < (uint)local_90) {
      uVar5 = (uint)local_90;
    }
    ppVar12 = (protobuf *)0x7f;
    if (0x7f < (uint)local_90) {
      ppVar12 = (protobuf *)(ulong)uVar5;
    }
    SimpleItoa_abi_cxx11_(&local_88,ppVar12,uVar9);
    pMVar16 = local_98;
    pcVar13 = "NoLastTag";
    if (bVar2) {
      pcVar13 = "";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar13,&local_99);
    io::Printer::Print(printer,
                       "::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoff$lasttag$($max$u);\ntag = p.first;\nif (!p.second) goto handle_unusual;\n"
                       ,"max",&local_88,"lasttag",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_88);
    if (0 < *(int *)(pMVar16->descriptor_ + 0x2c)) {
      io::Printer::Print(printer,
                         "switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {\n"
                        );
      io::Printer::Indent(printer);
      local_90 = &pMVar16->field_generators_;
      for (uVar18 = 0;
          uVar18 < (ulong)((long)ordered_fields.
                                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)ordered_fields.
                                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar18 = uVar18 + 1) {
        pFVar17 = ordered_fields.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar18];
        anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>(printer,pFVar17);
        SimpleItoa_abi_cxx11_(&local_88,(protobuf *)(ulong)*(uint *)(pFVar17 + 0x38),i_00);
        io::Printer::Print(printer,"case $number$: {\n","number",&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        io::Printer::Indent(printer);
        pFVar7 = FieldGeneratorMap::get(local_90,pFVar17);
        uVar3 = internal::WireFormat::MakeTag(pFVar17);
        SimpleItoa_abi_cxx11_(&local_88,(protobuf *)(ulong)uVar3,i_01);
        io::Printer::Print(printer,
                           "if (static_cast< ::google::protobuf::uint8>(tag) ==\n    static_cast< ::google::protobuf::uint8>($commontag$u)) {\n"
                           ,"commontag",&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        io::Printer::Indent(printer);
        bVar2 = FieldDescriptor::is_packed(pFVar17);
        (*pFVar7->_vptr_FieldGenerator[(ulong)bVar2 + 0x13])(pFVar7,printer);
        io::Printer::Outdent(printer);
        bVar2 = FieldDescriptor::is_packed(pFVar17);
        if (bVar2) {
          TVar4 = FieldDescriptor::type(pFVar17);
          SimpleItoa_abi_cxx11_
                    (&local_88,
                     (protobuf *)
                     (ulong)(*(int *)(pFVar17 + 0x38) << 3 |
                            *(uint *)(internal::WireFormatLite::kWireTypeForFieldType +
                                     (ulong)TVar4 * 4)),i_02);
          io::Printer::Print(printer,
                             "} else if (static_cast< ::google::protobuf::uint8>(tag) ==\n           static_cast< ::google::protobuf::uint8>($uncommontag$u)) {\n"
                             ,"uncommontag",&local_88);
          std::__cxx11::string::~string((string *)&local_88);
          io::Printer::Indent(printer);
          (*pFVar7->_vptr_FieldGenerator[0x13])(pFVar7,printer);
          io::Printer::Outdent(printer);
        }
        else {
          bVar2 = FieldDescriptor::is_packable(pFVar17);
          if (bVar2) {
            bVar2 = FieldDescriptor::is_packed(pFVar17);
            if (!bVar2) {
              SimpleItoa_abi_cxx11_
                        (&local_88,(protobuf *)(ulong)(*(int *)(pFVar17 + 0x38) * 8 + 2),i_03);
              io::Printer::Print(printer,
                                 "} else if (static_cast< ::google::protobuf::uint8>(tag) ==\n           static_cast< ::google::protobuf::uint8>($uncommontag$u)) {\n"
                                 ,"uncommontag",&local_88);
              std::__cxx11::string::~string((string *)&local_88);
              io::Printer::Indent(printer);
              (*pFVar7->_vptr_FieldGenerator[0x14])(pFVar7,printer);
              io::Printer::Outdent(printer);
            }
          }
        }
        io::Printer::Print(printer,"} else {\n  goto handle_unusual;\n}\n");
        io::Printer::Print(printer,"break;\n");
        io::Printer::Outdent(printer);
        io::Printer::Print(printer,"}\n\n");
      }
      io::Printer::Print(printer,"default: {\n");
      io::Printer::Indent(printer);
    }
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"handle_unusual:\n");
    io::Printer::Indent(printer);
    io::Printer::Print(printer,
                       "if (tag == 0 ||\n    ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==\n    ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {\n  goto success;\n}\n"
                      );
    pDVar8 = pMVar16->descriptor_;
    if (0 < *(int *)(pDVar8 + 0x68)) {
      io::Printer::Print(printer,"if (");
      lVar14 = 0;
      uVar10 = extraout_RDX_03;
      while( true ) {
        uVar9 = (uint)uVar10;
        if (*(int *)(pMVar16->descriptor_ + 0x68) <= lVar14) break;
        lVar11 = *(long *)(pMVar16->descriptor_ + 0x70);
        if (lVar14 != 0) {
          io::Printer::Print(printer," ||\n    ");
          uVar9 = extraout_EDX;
        }
        iVar1 = *(int *)(lVar11 + 4 + lVar14 * 8);
        ppVar12 = (protobuf *)(ulong)(uint)(*(int *)(lVar11 + lVar14 * 8) << 3);
        if (iVar1 < 0x20000000) {
          SimpleItoa_abi_cxx11_(&local_88,ppVar12,uVar9);
          pMVar16 = local_98;
          SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(ulong)(uint)(iVar1 << 3),i_04);
          io::Printer::Print(printer,"($start$u <= tag && tag < $end$u)","start",&local_88,"end",
                             &local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
        else {
          SimpleItoa_abi_cxx11_(&local_88,ppVar12,uVar9);
          pMVar16 = local_98;
          io::Printer::Print(printer,"($start$u <= tag)","start",&local_88);
        }
        std::__cxx11::string::~string((string *)&local_88);
        lVar14 = lVar14 + 1;
        uVar10 = extraout_RDX_04;
      }
      io::Printer::Print(printer,") {\n");
      if (*(int *)(*(long *)(pMVar16->descriptor_ + 0x10) + 0x8c) == 3) {
        pcVar13 = "  DO_(_extensions_.ParseField(tag, input, internal_default_instance());\n";
      }
      else if (((pMVar16->options_).enforce_lite == false) &&
              (*(int *)(*(long *)(*(long *)(pMVar16->descriptor_ + 0x10) + 0xa0) + 0xa8) != 3)) {
        pcVar13 = 
        "  DO_(_extensions_.ParseField(tag, input, internal_default_instance(),\n                              mutable_unknown_fields()));\n"
        ;
      }
      else {
        pcVar13 = 
        "  DO_(_extensions_.ParseField(tag, input, internal_default_instance(),\n                              &unknown_fields_stream));\n"
        ;
      }
      io::Printer::Print(printer,pcVar13);
      io::Printer::Print(printer,"  continue;\n}\n");
      pDVar8 = pMVar16->descriptor_;
    }
    if (*(int *)(*(long *)(pDVar8 + 0x10) + 0x8c) == 3) {
      pcVar13 = "DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));\n";
    }
    else if (((pMVar16->options_).enforce_lite == false) &&
            (*(int *)(*(long *)(*(long *)(pDVar8 + 0x10) + 0xa0) + 0xa8) != 3)) {
      pcVar13 = 
      "DO_(::google::protobuf::internal::WireFormat::SkipField(\n      input, tag, mutable_unknown_fields()));\n"
      ;
    }
    else {
      pcVar13 = 
      "DO_(::google::protobuf::internal::WireFormatLite::SkipField(\n    input, tag, &unknown_fields_stream));\n"
      ;
    }
    io::Printer::Print(printer,pcVar13);
    if (0 < *(int *)(pMVar16->descriptor_ + 0x2c)) {
      io::Printer::Print(printer,"break;\n");
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
    }
    io::Printer::Outdent(printer);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,
                       "  }\nsuccess:\n  // @@protoc_insertion_point(parse_success:$full_name$)\n  return true;\nfailure:\n  // @@protoc_insertion_point(parse_failure:$full_name$)\n  return false;\n#undef DO_\n}\n"
                       ,"full_name",*(string **)(pMVar16->descriptor_ + 8));
  }
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&ordered_fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 );
  return;
}

Assistant:

void MessageGenerator::
GenerateMergeFromCodedStream(io::Printer* printer) {
  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    printer->Print(
      "bool $classname$::MergePartialFromCodedStream(\n"
      "    ::google::protobuf::io::CodedInputStream* input) {\n",
      "classname", classname_);

    printer->Print(
        "  return _extensions_.ParseMessageSet(input, "
        "internal_default_instance(),\n"
        "                                      mutable_unknown_fields());\n",
        // Vars.
        "classname", classname_);

    printer->Print(
      "}\n");
    return;
  }

  std::vector<const FieldDescriptor*> ordered_fields =
      SortFieldsByNumber(descriptor_);

  printer->Print(
    "bool $classname$::MergePartialFromCodedStream(\n"
    "    ::google::protobuf::io::CodedInputStream* input) {\n",
    "classname", classname_);

  if (table_driven_) {
    printer->Indent();

    printer->Print(
        "return ::google::protobuf::internal::MergePartialFromCodedStream(\n"
        "    this,\n"
        "    $file_namespace$::TableStruct::schema[\n"
        "      $classname$::kIndexInFileMessages],\n"
        "    input);\n",
        "classname", classname_,
        "file_namespace", FileLevelNamespace(descriptor_->file()->name()));

    printer->Outdent();

    printer->Print("}\n");
    return;
  }

  printer->Print(
    "#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure\n"
    "  ::google::protobuf::uint32 tag;\n");

  if (PreserveUnknownFields(descriptor_) &&
      !UseUnknownFieldSet(descriptor_->file(), options_)) {
    // Use LazyStringOutputString to avoid initializing unknown fields string
    // unless it is actually needed. For the same reason, disable eager refresh
    // on the CodedOutputStream.
    printer->Print(
      "  ::google::protobuf::io::LazyStringOutputStream unknown_fields_string(\n"
      "      ::google::protobuf::NewPermanentCallback(&_internal_metadata_,\n"
      "          &::google::protobuf::internal::InternalMetadataWithArenaLite::\n"
      "              mutable_unknown_fields));\n"
      "  ::google::protobuf::io::CodedOutputStream unknown_fields_stream(\n"
      "      &unknown_fields_string, false);\n",
      "classname", classname_);
  }

  printer->Print(
    "  // @@protoc_insertion_point(parse_start:$full_name$)\n",
    "full_name", descriptor_->full_name());

  printer->Indent();
  printer->Print("for (;;) {\n");
  printer->Indent();

  uint32 maxtag = descriptor_->field_count() == 0 ? 0 :
      WireFormat::MakeTag(ordered_fields[descriptor_->field_count() - 1]);
  const int kCutoff0 = 127;               // fits in 1-byte varint
  const int kCutoff1 = (127 << 7) + 127;  // fits in 2-byte varint

  // We need to capture the last tag when parsing if this is a Group type, as
  // our caller will verify (via CodedInputStream::LastTagWas) that the correct
  // closing tag was received.
  bool capture_last_tag = false;
  const Descriptor* parent = descriptor_->containing_type();
  if (parent) {
    for (int i = 0; i < parent->field_count(); i++) {
      const FieldDescriptor* field = parent->field(i);
      if (field->type() == FieldDescriptor::TYPE_GROUP &&
          field->message_type() == descriptor_) {
        capture_last_tag = true;
        break;
      }
    }
  }

  for (int i = 0; i < descriptor_->file()->extension_count(); i++) {
    const FieldDescriptor* field = descriptor_->file()->extension(i);
    if (field->type() == FieldDescriptor::TYPE_GROUP &&
        field->message_type() == descriptor_) {
      capture_last_tag = true;
      break;
    }
  }

  printer->Print("::std::pair< ::google::protobuf::uint32, bool> p = "
                 "input->ReadTagWithCutoff$lasttag$($max$u);\n"
                 "tag = p.first;\n"
                 "if (!p.second) goto handle_unusual;\n",
                 "max", SimpleItoa(maxtag <= kCutoff0 ? kCutoff0 :
                                   (maxtag <= kCutoff1 ? kCutoff1 :
                                    maxtag)),
                 "lasttag", !capture_last_tag ? "NoLastTag" : "");

  if (descriptor_->field_count() > 0) {
    // We don't even want to print the switch() if we have no fields because
    // MSVC dislikes switch() statements that contain only a default value.

    // Note:  If we just switched on the tag rather than the field number, we
    // could avoid the need for the if() to check the wire type at the beginning
    // of each case.  However, this is actually a bit slower in practice as it
    // creates a jump table that is 8x larger and sparser, and meanwhile the
    // if()s are highly predictable.
    //
    // Historically, we inserted checks to peek at the next tag on the wire and
    // jump directly to the next case statement.  While this avoids the jump
    // table that the switch uses, it greatly increases code size (20-60%) and
    // inserts branches that may fail (especially for real world protos that
    // interleave--in field number order--hot and cold fields).  Loadtests
    // confirmed that removing this optimization is performance neutral.
    printer->Print("switch (::google::protobuf::internal::WireFormatLite::"
                   "GetTagFieldNumber(tag)) {\n");

    printer->Indent();

    for (int i = 0; i < ordered_fields.size(); i++) {
      const FieldDescriptor* field = ordered_fields[i];

      PrintFieldComment(printer, field);

      printer->Print(
        "case $number$: {\n",
        "number", SimpleItoa(field->number()));
      printer->Indent();
      const FieldGenerator& field_generator = field_generators_.get(field);

      // Emit code to parse the common, expected case.
      printer->Print("if (static_cast< ::google::protobuf::uint8>(tag) ==\n"
                     "    static_cast< ::google::protobuf::uint8>($commontag$u)) {\n",
          "commontag", SimpleItoa(WireFormat::MakeTag(field)));

      printer->Indent();
      if (field->is_packed()) {
        field_generator.GenerateMergeFromCodedStreamWithPacking(printer);
      } else {
        field_generator.GenerateMergeFromCodedStream(printer);
      }
      printer->Outdent();

      // Emit code to parse unexpectedly packed or unpacked values.
      if (field->is_packed()) {
        internal::WireFormatLite::WireType wiretype =
            WireFormat::WireTypeForFieldType(field->type());
        printer->Print("} else if (static_cast< ::google::protobuf::uint8>(tag) ==\n"
                       "           static_cast< ::google::protobuf::uint8>($uncommontag$u)) {\n",
                       "uncommontag", SimpleItoa(
                           internal::WireFormatLite::MakeTag(
                               field->number(), wiretype)));
        printer->Indent();
        field_generator.GenerateMergeFromCodedStream(printer);
        printer->Outdent();
      } else if (field->is_packable() && !field->is_packed()) {
        internal::WireFormatLite::WireType wiretype =
            internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED;
        printer->Print("} else if (static_cast< ::google::protobuf::uint8>(tag) ==\n"
                       "           static_cast< ::google::protobuf::uint8>($uncommontag$u)) {\n",
                       "uncommontag", SimpleItoa(
                           internal::WireFormatLite::MakeTag(
                               field->number(), wiretype)));
        printer->Indent();
        field_generator.GenerateMergeFromCodedStreamWithPacking(printer);
        printer->Outdent();
      }

      printer->Print(
        "} else {\n"
        "  goto handle_unusual;\n"
        "}\n");

      printer->Print(
        "break;\n");

      printer->Outdent();
      printer->Print("}\n\n");
    }

    printer->Print("default: {\n");
    printer->Indent();
  }

  printer->Outdent();
  printer->Print("handle_unusual:\n");
  printer->Indent();
  // If tag is 0 or an end-group tag then this must be the end of the message.
  printer->Print(
    "if (tag == 0 ||\n"
    "    ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==\n"
    "    ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {\n"
    "  goto success;\n"
    "}\n");

  // Handle extension ranges.
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "if (");
    for (int i = 0; i < descriptor_->extension_range_count(); i++) {
      const Descriptor::ExtensionRange* range =
        descriptor_->extension_range(i);
      if (i > 0) printer->Print(" ||\n    ");

      uint32 start_tag = WireFormatLite::MakeTag(
        range->start, static_cast<WireFormatLite::WireType>(0));
      uint32 end_tag = WireFormatLite::MakeTag(
        range->end, static_cast<WireFormatLite::WireType>(0));

      if (range->end > FieldDescriptor::kMaxNumber) {
        printer->Print(
          "($start$u <= tag)",
          "start", SimpleItoa(start_tag));
      } else {
        printer->Print(
          "($start$u <= tag && tag < $end$u)",
          "start", SimpleItoa(start_tag),
          "end", SimpleItoa(end_tag));
      }
    }
    printer->Print(") {\n");
    if (PreserveUnknownFields(descriptor_)) {
      if (UseUnknownFieldSet(descriptor_->file(), options_)) {
        printer->Print(
            "  DO_(_extensions_.ParseField(tag, input, "
            "internal_default_instance(),\n"
            "                              mutable_unknown_fields()));\n");
      } else {
        printer->Print(
            "  DO_(_extensions_.ParseField(tag, input, "
            "internal_default_instance(),\n"
            "                              &unknown_fields_stream));\n");
      }
    } else {
      printer->Print(
          // With static initializers.
          "  DO_(_extensions_.ParseField(tag, input, "
          "internal_default_instance());\n");
    }
    printer->Print(
      "  continue;\n"
      "}\n");
  }

  // We really don't recognize this tag.  Skip it.
  if (PreserveUnknownFields(descriptor_)) {
    if (UseUnknownFieldSet(descriptor_->file(), options_)) {
      printer->Print(
        "DO_(::google::protobuf::internal::WireFormat::SkipField(\n"
        "      input, tag, mutable_unknown_fields()));\n");
    } else {
      printer->Print(
        "DO_(::google::protobuf::internal::WireFormatLite::SkipField(\n"
        "    input, tag, &unknown_fields_stream));\n");
    }
  } else {
    printer->Print(
      "DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));\n");
  }

  if (descriptor_->field_count() > 0) {
    printer->Print("break;\n");
    printer->Outdent();
    printer->Print("}\n");    // default:
    printer->Outdent();
    printer->Print("}\n");    // switch
  }

  printer->Outdent();
  printer->Outdent();
  printer->Print(
    "  }\n"                   // for (;;)
    "success:\n"
    "  // @@protoc_insertion_point(parse_success:$full_name$)\n"
    "  return true;\n"
    "failure:\n"
    "  // @@protoc_insertion_point(parse_failure:$full_name$)\n"
    "  return false;\n"
    "#undef DO_\n"
    "}\n", "full_name", descriptor_->full_name());
}